

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMocker<void_(void_*,_unsigned_long)>::UntypedPerformAction
          (FunctionMocker<void_(void_*,_unsigned_long)> *this,void *untyped_action,
          void *untyped_args)

{
  UntypedActionResultHolderBase *pUVar1;
  ArgumentTuple *args;
  Action<void_(void_*,_unsigned_long)> action;
  void *untyped_args_local;
  void *untyped_action_local;
  FunctionMocker<void_(void_*,_unsigned_long)> *this_local;
  
  action.fun_._M_invoker = (_Invoker_type)untyped_args;
  Action<void_(void_*,_unsigned_long)>::Action
            ((Action<void_(void_*,_unsigned_long)> *)&args,
             (Action<void_(void_*,_unsigned_long)> *)untyped_action);
  pUVar1 = &ActionResultHolder<void>::PerformAction<void(void*,unsigned_long)>
                      ((Action<void_(void_*,_unsigned_long)> *)&args,
                       (ArgumentTuple *)action.fun_._M_invoker)->super_UntypedActionResultHolderBase
  ;
  Action<void_(void_*,_unsigned_long)>::~Action((Action<void_(void_*,_unsigned_long)> *)&args);
  return pUVar1;
}

Assistant:

UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, void* untyped_args) const override {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    ArgumentTuple* args = static_cast<ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, std::move(*args));
  }